

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape_on_grid.h
# Opt level: O3

void __thiscall
Gudhi::Persistence_representations::Persistence_landscape_on_grid::Persistence_landscape_on_grid
          (Persistence_landscape_on_grid *this,char *filename,double grid_min_,double grid_max_,
          size_t number_of_points_,uint number_of_levels_of_landscape,uint16_t dimension)

{
  pointer ppVar1;
  pointer ppVar2;
  undefined2 in_register_00000082;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> p;
  allocator<char> local_99;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_98;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_78;
  string local_58;
  double local_38;
  double local_30;
  
  (this->values_of_landscapes).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->values_of_landscapes).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->values_of_landscapes).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = grid_min_;
  local_30 = grid_max_;
  if (CONCAT22(in_register_00000082,dimension) == 0xffff) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,filename,&local_99);
    read_persistence_intervals_in_one_dimension_from_file(&local_98,&local_58,-1,-1.0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,filename,&local_99);
    read_persistence_intervals_in_one_dimension_from_file
              (&local_98,&local_58,CONCAT22(in_register_00000082,dimension),-1.0);
  }
  ppVar2 = local_98.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ppVar1 = local_98.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_78.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       local_98.
       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_78.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       local_98.
       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_78.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       local_98.
       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  set_up_values_of_landscapes
            (this,&local_78,local_38,local_30,number_of_points_,number_of_levels_of_landscape);
  if (ppVar1 != (pointer)0x0) {
    operator_delete(ppVar1,(long)ppVar2 - (long)ppVar1);
  }
  return;
}

Assistant:

Persistence_landscape_on_grid::Persistence_landscape_on_grid(const char* filename, double grid_min_, double grid_max_,
                                                             size_t number_of_points_,
                                                             unsigned number_of_levels_of_landscape,
                                                             uint16_t dimension) {
  std::vector<std::pair<double, double> > p;
  if (dimension == std::numeric_limits<uint16_t>::max()) {
    p = read_persistence_intervals_in_one_dimension_from_file(filename);
  } else {
    p = read_persistence_intervals_in_one_dimension_from_file(filename, dimension);
  }
  this->set_up_values_of_landscapes(p, grid_min_, grid_max_, number_of_points_, number_of_levels_of_landscape);
}